

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O1

void Enhedron::Test::Impl::Impl_Suite::
     makeContextList<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>>
               (Out<std::vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>_>
                contextList,
               unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
               *childContext,
               unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
               *childContextList,
               unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
               *childContextList_1,
               unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
               *childContextList_2,
               unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
               *childContextList_3,
               unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
               *childContextList_4,
               unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
               *childContextList_5,
               unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
               *childContextList_6,
               unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
               *childContextList_7,
               unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
               *childContextList_8,
               unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
               *childContextList_9,
               unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
               *childContextList_10)

{
  _Head_base<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_false> local_38;
  
  ::std::
  vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>>>
  ::
  emplace_back<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>>
            ((vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>>>
              *)contextList.value,childContext);
  local_38._M_head_impl =
       (childContextList->_M_t).
       super___uniq_ptr_impl<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
       ._M_t.
       super__Tuple_impl<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
       .super__Head_base<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_false>._M_head_impl;
  (childContextList->_M_t).
  super___uniq_ptr_impl<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
  ._M_t.
  super__Tuple_impl<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
  .super__Head_base<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_false>._M_head_impl =
       (Context *)0x0;
  makeContextList<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>>
            (contextList,
             (unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
              *)&local_38,childContextList_1,childContextList_2,childContextList_3,
             childContextList_4,childContextList_5,childContextList_6,childContextList_7,
             childContextList_8,childContextList_9,childContextList_10);
  if (local_38._M_head_impl != (Context *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Context[1])();
  }
  return;
}

Assistant:

void makeContextList(Out<ContextList> contextList, unique_ptr<Context> childContext, ContextListType&&... childContextList) {
        contextList->emplace_back(move(childContext));
        makeContextList(contextList, forward<ContextListType>(childContextList)...);
    }